

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void gen_gvec_op2i(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int64_t imm,
                  GVecGen2i_conflict1 *gvec_op)

{
  undefined7 in_register_00000031;
  
  tcg_gen_gvec_2i_aarch64
            (s->uc->tcg_ctx,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,
             (int)CONCAT71(in_register_00000031,is_q) * 8 + 8,s->sve_len,imm,gvec_op);
  return;
}

Assistant:

static void gen_gvec_op2i(DisasContext *s, bool is_q, int rd,
                          int rn, int64_t imm, const GVecGen2i *gvec_op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_gvec_2i(tcg_ctx, vec_full_reg_offset(s, rd), vec_full_reg_offset(s, rn),
                    is_q ? 16 : 8, vec_full_reg_size(s), imm, gvec_op);
}